

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O1

bool __thiscall
DIS::ElectromagneticEmissionsPdu::operator==
          (ElectromagneticEmissionsPdu *this,ElectromagneticEmissionsPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pEVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_emittingEntityID,&rhs->_emittingEntityID);
  bVar3 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  bVar1 = this->_paddingForEmissionsPdu == rhs->_paddingForEmissionsPdu &&
          (this->_stateUpdateIndicator == rhs->_stateUpdateIndicator && (bVar3 && (bVar2 && bVar1)))
  ;
  pEVar4 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_systems).
      super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = ElectromagneticEmissionSystemData::operator==
                        ((ElectromagneticEmissionSystemData *)
                         ((long)&pEVar4->_vptr_ElectromagneticEmissionSystemData + lVar5),
                         (ElectromagneticEmissionSystemData *)
                         ((long)&((rhs->_systems).
                                  super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_ElectromagneticEmissionSystemData + lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_systems).
               super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x50;
    } while (uVar6 < (ulong)(((long)(this->_systems).
                                    super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4)
                            * -0x3333333333333333));
  }
  return bVar1;
}

Assistant:

bool ElectromagneticEmissionsPdu::operator ==(const ElectromagneticEmissionsPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_emittingEntityID == rhs._emittingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_stateUpdateIndicator == rhs._stateUpdateIndicator) ) ivarsEqual = false;
     if( ! (_paddingForEmissionsPdu == rhs._paddingForEmissionsPdu) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _systems.size(); idx++)
     {
        if( ! ( _systems[idx] == rhs._systems[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }